

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall QCss::Parser::parseSelector(Parser *this,Selector *sel)

{
  int iVar1;
  TokenType TVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QCss::Pseudo> local_138;
  QArrayData *local_118;
  char16_t *pcStack_110;
  qsizetype local_108;
  QArrayDataPointer<QString> local_100;
  QArrayDataPointer<QCss::Pseudo> local_e8;
  QArrayDataPointer<QCss::AttributeSelector> QStack_d0;
  Relation local_b8;
  BasicSelector local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.elementName.d.d = (Data *)0x0;
  local_a8.elementName.d.ptr = (char16_t *)0x0;
  local_a8.elementName.d.size = 0;
  local_a8.ids.d.d = (Data *)0x0;
  local_a8.ids.d.ptr = (QString *)0x0;
  local_a8.ids.d.size = 0;
  local_a8.pseudos.d.d = (Data *)0x0;
  local_a8.pseudos.d.ptr = (Pseudo *)0x0;
  local_a8.pseudos.d.size = 0;
  local_a8.attributeSelectors.d.d = (Data *)0x0;
  local_a8.attributeSelectors.d.ptr = (AttributeSelector *)0x0;
  local_a8.attributeSelectors.d.size = 0;
  local_a8.relationToNext = NoRelation;
  local_a8._100_4_ = 0xaaaaaaaa;
  bVar3 = parseSimpleSelector(this,&local_a8);
  if (bVar3) {
    do {
      iVar1 = this->index;
      if ((((this->symbols).d.size <= (long)iVar1) ||
          (TVar2 = (this->symbols).d.ptr[iVar1].token, TILDE < TVar2)) ||
         ((0x2c02U >> (TVar2 & LBRACKET) & 1) == 0)) {
LAB_005e3bef:
        QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
                  ((QMovableArrayOps<QCss::BasicSelector> *)sel,(sel->basicSelectors).d.size,
                   &local_a8);
        QList<QCss::BasicSelector>::end(&sel->basicSelectors);
        bVar3 = true;
        goto LAB_005e3c0d;
      }
      this->index = iVar1 + 1;
      parseCombinator(this,&local_a8.relationToNext);
      bVar3 = testSimpleSelector(this);
      if (!bVar3) goto LAB_005e3bef;
      QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
                ((QMovableArrayOps<QCss::BasicSelector> *)sel,(sel->basicSelectors).d.size,&local_a8
                );
      QList<QCss::BasicSelector>::end(&sel->basicSelectors);
      local_138.size = local_a8.ids.d.size;
      local_138.ptr = (Pseudo *)local_a8.ids.d.ptr;
      local_138.d = (Data *)local_a8.ids.d.d;
      local_108 = local_a8.elementName.d.size;
      pcStack_110 = local_a8.elementName.d.ptr;
      local_118 = &(local_a8.elementName.d.d)->super_QArrayData;
      QStack_d0.ptr = (AttributeSelector *)0x0;
      QStack_d0.size = 0;
      local_e8.size = 0;
      QStack_d0.d = (Data *)0x0;
      local_e8.d = (Data *)0x0;
      local_e8.ptr = (Pseudo *)0x0;
      local_b8 = NoRelation;
      local_a8.elementName.d.d = (Data *)0x0;
      local_a8.elementName.d.ptr = (char16_t *)0x0;
      local_a8.elementName.d.size = 0;
      local_100.size = 0;
      local_100.d = (Data *)0x0;
      local_100.ptr = (QString *)0x0;
      local_a8.ids.d.d = (Data *)0x0;
      local_a8.ids.d.ptr = (QString *)0x0;
      local_a8.ids.d.size = 0;
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_138);
      local_138.size = local_a8.pseudos.d.size;
      local_138.ptr = local_a8.pseudos.d.ptr;
      local_138.d = local_a8.pseudos.d.d;
      local_a8.pseudos.d.size = local_e8.size;
      local_a8.pseudos.d.ptr = local_e8.ptr;
      local_a8.pseudos.d.d = local_e8.d;
      local_e8.size = 0;
      local_e8.d = (Data *)0x0;
      local_e8.ptr = (Pseudo *)0x0;
      QArrayDataPointer<QCss::Pseudo>::~QArrayDataPointer(&local_138);
      local_138.size = local_a8.attributeSelectors.d.size;
      local_138.ptr = (Pseudo *)local_a8.attributeSelectors.d.ptr;
      local_138.d = (Data *)local_a8.attributeSelectors.d.d;
      local_a8.attributeSelectors.d.size = QStack_d0.size;
      local_a8.attributeSelectors.d.ptr = QStack_d0.ptr;
      local_a8.attributeSelectors.d.d = QStack_d0.d;
      QStack_d0.size = 0;
      QStack_d0.d = (Data *)0x0;
      QStack_d0.ptr = (AttributeSelector *)0x0;
      QArrayDataPointer<QCss::AttributeSelector>::~QArrayDataPointer
                ((QArrayDataPointer<QCss::AttributeSelector> *)&local_138);
      local_a8.relationToNext = local_b8;
      QArrayDataPointer<QCss::AttributeSelector>::~QArrayDataPointer(&QStack_d0);
      QArrayDataPointer<QCss::Pseudo>::~QArrayDataPointer(&local_e8);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_100);
      if (local_118 != (QArrayData *)0x0) {
        LOCK();
        (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_118,2,0x10);
        }
      }
      bVar3 = parseSimpleSelector(this,&local_a8);
    } while (bVar3);
  }
  bVar3 = false;
LAB_005e3c0d:
  QArrayDataPointer<QCss::AttributeSelector>::~QArrayDataPointer(&local_a8.attributeSelectors.d);
  QArrayDataPointer<QCss::Pseudo>::~QArrayDataPointer(&local_a8.pseudos.d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8.ids.d);
  if (&(local_a8.elementName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.elementName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.elementName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_a8.elementName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_a8.elementName.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseSelector(Selector *sel)
{
    BasicSelector basicSel;
    if (!parseSimpleSelector(&basicSel)) return false;
    while (testCombinator()) {
        if (!parseCombinator(&basicSel.relationToNext)) return false;

        if (!testSimpleSelector()) break;
        sel->basicSelectors.append(basicSel);

        basicSel = BasicSelector();
        if (!parseSimpleSelector(&basicSel)) return false;
    }
    sel->basicSelectors.append(basicSel);
    return true;
}